

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

bool TestConstExpr::EqualTest<int,signed_char>(void)

{
  bool bVar1;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 uVar2;
  int in_stack_ffffffffffffffd0;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffffd4;
  int local_28;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_24;
  undefined4 local_20;
  int local_18;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_14;
  int local_10;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_c;
  int local_8;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_4;
  
  local_8 = 3;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
            (&local_4,&local_8);
  bVar1 = ::operator==((char)((uint)in_stack_ffffffffffffffd0 >> 0x18),in_stack_ffffffffffffffd4);
  uVar2 = false;
  if (bVar1) {
    local_10 = 4;
    SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (&local_c,&local_10);
    bVar1 = ::operator==(in_stack_ffffffffffffffd4,(char)((uint)in_stack_ffffffffffffffd0 >> 0x18));
    uVar2 = false;
    if (bVar1) {
      local_18 = 6;
      SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
                (&local_14,&local_18);
      local_20 = 7;
      SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
      SafeInt<int>((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                    *)CONCAT44(in_stack_ffffffffffffffd4.m_int,in_stack_ffffffffffffffd0),
                   (int *)CONCAT17(uVar2,in_stack_ffffffffffffffc8));
      rhs.m_int = (char)((uint)in_stack_ffffffffffffffd0 >> 0x18);
      bVar1 = ::operator==(in_stack_ffffffffffffffd4,rhs);
      uVar2 = false;
      if (bVar1) {
        local_28 = 1;
        SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
        SafeInt(&local_24,&local_28);
        bVar1 = ::operator==((bool)rhs.m_int,in_stack_ffffffffffffffd4);
        uVar2 = false;
        if (bVar1) {
          bVar1 = false;
          SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
          SafeInt((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                   *)&stack0xffffffffffffffd4,(int *)&stack0xffffffffffffffd0);
          uVar2 = ::operator==(bVar1,in_stack_ffffffffffffffd4);
        }
      }
    }
  }
  return (bool)uVar2;
}

Assistant:

SAFEINT_CONSTEXPR11 bool EqualTest()
	{
		return
			(U)2 == SafeInt<T>(3) &&
			SafeInt<T>(4) == (U)5 &&
			SafeInt<T>(6) == SafeInt<U>(7) &&
			true == SafeInt<T>(1) &&
			false == SafeInt<T>(0);
	}